

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

void __thiscall QItemDelegate::setEditorData(QItemDelegate *this,QWidget *editor,QModelIndex *index)

{
  bool bVar1;
  char *pcVar2;
  QMetaType *pQVar3;
  QModelIndex *in_RDX;
  QObject *in_RSI;
  long in_FS_OFFSET;
  QByteArray n;
  QVariant v;
  char *in_stack_ffffffffffffff28;
  QVariant *in_stack_ffffffffffffff30;
  QObject *this_00;
  undefined8 in_stack_ffffffffffffff40;
  QByteArray local_80;
  QVariant local_68;
  QVariant local_48;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::data(in_RDX,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  local_80.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_80.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_80.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (*(code *)**(undefined8 **)in_RSI)();
  QMetaObject::userProperty();
  pcVar2 = (char *)QMetaProperty::name();
  QByteArray::QByteArray(&local_80,pcVar2,-1);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x853ee1);
  if (!bVar1) {
    bVar1 = ::QVariant::isValid(in_stack_ffffffffffffff30);
    if (!bVar1) {
      this_00 = in_RSI;
      QByteArray::operator_cast_to_char_((QByteArray *)0x853f0e);
      QObject::property((char *)&local_68);
      pQVar3 = (QMetaType *)::QVariant::metaType();
      ::QVariant::QVariant(&local_48,pQVar3,(void *)0x0);
      ::QVariant::operator=((QVariant *)this_00,in_stack_ffffffffffffff30);
      ::QVariant::~QVariant(&local_48);
      ::QVariant::~QVariant(&local_68);
    }
    QByteArray::operator_cast_to_char_((QByteArray *)0x853f85);
    QObject::setProperty(in_RSI,in_stack_ffffffffffffff28,(QVariant *)0x853f9a);
  }
  QByteArray::~QByteArray((QByteArray *)0x853fa4);
  ::QVariant::~QVariant((QVariant *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemDelegate::setEditorData(QWidget *editor, const QModelIndex &index) const
{
    QVariant v = index.data(Qt::EditRole);
    QByteArray n = editor->metaObject()->userProperty().name();

    if (!n.isEmpty()) {
        if (!v.isValid())
            v = QVariant(editor->property(n).metaType());
        editor->setProperty(n, v);
    }
}